

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O1

uint quarticSolver(double *ce,double *roots)

{
  uint i_1;
  uint uVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  uint i;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined4 uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double croots [3];
  double cubic [3];
  double local_68 [4];
  double local_48 [3];
  
  dVar6 = *ce;
  dVar7 = ce[1];
  dVar9 = dVar6 * 0.25;
  dVar5 = dVar6 * dVar6 * -0.375 + dVar7;
  dVar11 = (dVar6 * dVar6 * 0.125 + dVar7 * -0.5) * dVar6 + ce[2];
  dVar6 = (dVar9 * dVar9 * -3.0 + dVar7) * dVar9 * dVar9 + (ce[3] - ce[2] * dVar9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"quarticSolver:: p=",0x12);
  poVar2 = std::ostream::_M_insert<double>(dVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tq=",3);
  poVar2 = std::ostream::_M_insert<double>(dVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tr=",3);
  poVar2 = std::ostream::_M_insert<double>(dVar6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (ABS(dVar11) <= 1e-75) {
    dVar6 = dVar5 * 0.25 * dVar5 - dVar6;
    if (dVar6 < 0.0) {
      return 0;
    }
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar6 = dVar5 * -0.5 - dVar6;
    dVar7 = -dVar5 - dVar6;
    if (dVar6 < 0.0) {
      if (0.0 <= dVar7) {
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        *roots = dVar7 - dVar9;
        roots[1] = -(dVar7 - dVar9) - dVar9;
        return 2;
      }
      return 0;
    }
    dVar11 = SQRT(dVar6);
    dVar5 = dVar11;
    if (dVar6 < 0.0) {
      dVar5 = sqrt(dVar6);
    }
    *roots = dVar5 - dVar9;
    if (dVar6 < 0.0) {
      dVar11 = sqrt(dVar6);
    }
    roots[1] = -dVar11 - dVar9;
    dVar6 = SQRT(dVar7);
    dVar5 = dVar6;
    if (dVar7 < 0.0) {
      dVar5 = sqrt(dVar7);
    }
    roots[2] = dVar5 - dVar9;
    if (dVar7 < 0.0) {
      dVar6 = sqrt(dVar7);
    }
    roots[3] = -dVar6 - dVar9;
    return 4;
  }
  if (ABS(dVar6) < 1e-75) {
    uVar4 = 0;
    local_48[0] = 0.0;
    *roots = 0.0;
    local_48[1] = dVar5;
    local_48[2] = dVar11;
    uVar1 = cubicSolver(local_48,roots + 1);
    do {
      roots[uVar4] = roots[uVar4] - dVar9;
      uVar4 = uVar4 + 1;
    } while (uVar1 + 1 != uVar4);
    return uVar1 + 1;
  }
  local_48[0] = dVar5 + dVar5;
  local_48[1] = dVar5 * dVar5 + dVar6 * -4.0;
  local_48[2] = -dVar11 * dVar11;
  uVar1 = cubicSolver(local_48,local_68);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"quarticSolver:: real roots from cubic: ",0x27);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  uVar4 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cubic[",6);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]=",2);
    poVar2 = std::ostream::_M_insert<double>(local_48[uVar4]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," x= ",4);
    poVar2 = std::ostream::_M_insert<double>(local_68[uVar4]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    uVar4 = uVar4 + 1;
  } while (uVar1 != uVar4);
  if (uVar1 != 1) {
    if (local_68[0] <= 0.0) {
      return 0;
    }
    if (0.0 < local_68[1]) {
      if (local_68[0] < 0.0) {
        dVar6 = sqrt(local_68[0]);
      }
      else {
        dVar6 = SQRT(local_68[0]);
      }
      dVar7 = (dVar11 * 0.5) / dVar6;
      dVar10 = dVar6 * 0.25 * dVar6;
      dVar11 = dVar10 - ((dVar5 + local_68[0]) * 0.5 + dVar7);
      if (0.0 <= dVar11) {
        if (dVar11 < 0.0) {
          dVar11 = sqrt(dVar11);
        }
        else {
          dVar11 = SQRT(dVar11);
        }
        dVar11 = -dVar6 * -0.5 + dVar11;
        *roots = dVar11;
        roots[1] = dVar6 - dVar11;
      }
      dVar10 = dVar10 - ((dVar5 + local_68[0]) * 0.5 - dVar7);
      if (0.0 <= dVar10) {
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        dVar10 = dVar6 * -0.5 + dVar10;
        roots[2] = dVar10;
        roots[3] = -dVar6 - dVar10;
      }
      lVar3 = 0;
      do {
        roots[lVar3] = roots[lVar3] - dVar9;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      return 4;
    }
    return 0;
  }
  if (local_68[0] < 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Quartic Error:: Found one real root for cubic, but negative\n"
               ,0x3c);
    return 0;
  }
  if (local_68[0] < 0.0) {
    dVar6 = sqrt(local_68[0]);
  }
  else {
    dVar6 = SQRT(local_68[0]);
  }
  dVar10 = (dVar11 * 0.5) / dVar6;
  dVar7 = dVar6 * 0.25 * dVar6;
  dVar11 = dVar7 - ((dVar5 + local_68[0]) * 0.5 + dVar10);
  if (0.0 <= dVar11) {
    uVar8 = (undefined4)((ulong)-dVar6 >> 0x20);
    dVar7 = dVar6;
  }
  else {
    dVar11 = dVar7 - ((dVar5 + local_68[0]) * 0.5 - dVar10);
    uVar8 = (undefined4)((ulong)dVar6 >> 0x20);
    dVar7 = -dVar6;
    if (dVar11 < 0.0) goto LAB_0010a75e;
  }
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  dVar11 = (double)CONCAT44(uVar8,SUB84(dVar6,0)) * -0.5 + dVar11;
  *roots = dVar11;
  roots[1] = dVar7 - dVar11;
LAB_0010a75e:
  lVar3 = 0;
  do {
    roots[lVar3] = roots[lVar3] - dVar9;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  return 2;
}

Assistant:

unsigned int quarticSolver(double * ce, double *roots)
//quartic solver
// x^4 + ce[0] x^3 + ce[1] x^2 + ce[2] x + ce[3] = 0
{
    // x^4 + a x^3 + b x^2 +c x + d = 0
    // depressed quartic, x= t - a/4
    // t^4 + ( b - 3/8 a^2 ) t^2 + (c - a b/2 + a^3/8) t + d - a c /4 + a^2 b/16 - 3 a^4/256 =0
    // t^4 + p t^2 + q t + r =0
    // p= b - (3./8)*a*a;
    // q= c - 0.5*a*b+(1./8)*a*a*a;
    // r= d - 0.25*a*c+(1./16)*a*a*b-(3./256)*a^4
    unsigned int ret=0;
    double shift=0.25*ce[0];
    double shift2=shift*shift;
    double a2=ce[0]*ce[0];
    double p= ce[1] - (3./8)*a2;
    double q= ce[2] + ce[0]*((1./8)*a2 - 0.5*ce[1]);
    double r= ce[3] - shift*ce[2] + (ce[1] - 3.*shift2)*shift2;
    std::cout<<"quarticSolver:: p="<<p<<"\tq="<<q<<"\tr="<<r<<std::endl;
    if (fabs(q) <= 1.0e-75) {// Biquadratic equations
        double discriminant= 0.25*p*p -r;
        if (discriminant < 0.) {
            return 0;
        }
        double t2[2];
        t2[0]=-0.5*p-sqrt(discriminant);
        t2[1]= -p - t2[0];
        if ( t2[0] >= 0. ) {// four real roots
            roots[0]=sqrt(t2[0])-shift;
            roots[1]= -sqrt(t2[0])-shift;
            roots[2]=sqrt(t2[1])-shift;
            roots[3]= -sqrt(t2[1])-shift;
            return 4;
        }
        if ( t2[1] >= 0.) { // two real roots
            roots[0]=sqrt(t2[1])-shift;
            roots[1]= -roots[0]-shift;
            return 2;
        }
        return 0;
    }
    if ( fabs(r)< 1.0e-75 ) {
        double cubic[3]= {0.,p,q};
        roots[0]=0.;
        ret=1+cubicSolver(cubic,roots+1);
        for(unsigned int i=0; i<ret; i++) roots[i] -= shift;
        return ret;
    }
    // depressed quartic to two quadratic equations
    // t^4 + p t^2 + q t + r = ( t^2 + u t + v) ( t^2 - u t + w)
    // so,
    // 	p + u^2= w+v
    // 	q/u= w-v
    // 	r= wv
    // so,
    //  (p+u^2)^2 - (q/u)^2 = 4 r
    //  y=u^2,
    //  y^3 + 2 p y^2 + ( p^2 - 4 r) y - q^2 =0
    //
    double cubic[3]= {2.*p,p*p-4.*r,-q*q},croots[3];
    ret = cubicSolver(cubic,croots);
    std::cout<<"quarticSolver:: real roots from cubic: "<<ret<<std::endl;
    for(unsigned int i=0; i<ret; i++)
        std::cout<<"cubic["<<i<<"]="<<cubic[i]<<" x= "<<croots[i]<<std::endl;
    if (ret==1) { //one real root from cubic
        if (croots[0]< 0.) {//this should not happen
            std::cerr<<"Quartic Error:: Found one real root for cubic, but negative\n";
            return 0;
        }
        double sqrtz0=sqrt(croots[0]);
        double ce2[2];
        ce2[0]=	-sqrtz0;
        ce2[1]=0.5*(p+croots[0])+0.5*q/sqrtz0;
        ret=quadraticSolver(ce2,roots);
        if (! ret ) {
            ce2[0]=	sqrtz0;
            ce2[1]=0.5*(p+croots[0])-0.5*q/sqrtz0;
            ret=quadraticSolver(ce2,roots);
        }
        ret=2;
        for(unsigned int i=0; i<ret; i++) roots[i] -= shift;
        return ret;
    }
    if ( croots[0]> 0. && croots[1] > 0. ) {
        double sqrtz0=sqrt(croots[0]);
        double ce2[2];
        ce2[0]=	-sqrtz0;
        ce2[1]=0.5*(p+croots[0])+0.5*q/sqrtz0;
        ret=quadraticSolver(ce2,roots);
        ce2[0]=	sqrtz0;
        ce2[1]=0.5*(p+croots[0])-0.5*q/sqrtz0;
        ret=quadraticSolver(ce2,roots+2);
        ret=4;
        for(unsigned int i=0; i<ret; i++) roots[i] -= shift;
        return ret;
    }
    return 0;



}